

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O2

size_t __thiscall
CVmObjStrComp::match_chars(CVmObjStrComp *this,wchar_t *valstr,size_t vallen,wchar_t refch)

{
  wchar_t wVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  size_t ovallen;
  size_t sVar7;
  wchar_t refch_local;
  size_t vallen_local;
  wchar_t *valstr_local;
  wchar_t *refstr;
  size_t reflen;
  
  wVar1 = *valstr;
  if (wVar1 == refch) {
    sVar7 = 1;
  }
  else {
    pcVar3 = (this->super_CVmObject).ext_;
    iVar2 = *(int *)(pcVar3 + 8);
    refch_local = refch;
    vallen_local = vallen;
    valstr_local = valstr;
    if (iVar2 == 0) {
      reflen = 1;
      refstr = &refch_local;
      iVar6 = t3_compare_case_fold_min(&valstr_local,&vallen_local,&refstr,&reflen);
      if (iVar6 == 0) {
        return vallen - vallen_local;
      }
    }
    lVar4 = *(long *)(pcVar3 + (ulong)((uint)refch_local >> 8 & 0xff) * 8 + 0x10);
    if ((lVar4 == 0) ||
       (puVar5 = *(undefined8 **)(lVar4 + (ulong)(uint)(refch_local & 0xff) * 8),
       puVar5 == (undefined8 *)0x0)) {
      sVar7 = 0;
    }
    else {
      reflen = puVar5[1];
      refstr = (wchar_t *)*puVar5;
      while ((vallen_local != 0 && (refstr != (wchar_t *)0x0))) {
        refch_local = *(wchar_t *)reflen;
        if (refch_local == wVar1) {
          valstr_local = valstr_local + 1;
          vallen_local = vallen_local - 1;
          reflen = reflen + 4;
          refstr = (wchar_t *)((long)refstr + -1);
        }
        else {
          if (iVar2 != 0) {
            return 0;
          }
          iVar6 = t3_compare_case_fold_min
                            (&valstr_local,&vallen_local,(wchar_t **)&reflen,(size_t *)&refstr);
          if (iVar6 != 0) {
            return 0;
          }
        }
      }
      sVar7 = (long)valstr_local - (long)valstr >> 2;
    }
  }
  return sVar7;
}

Assistant:

size_t CVmObjStrComp::match_chars(const wchar_t *valstr, size_t vallen,
                                  wchar_t refch)
{
    vmobj_strcmp_ext *ext = get_ext();
    int fold_case = !(ext->case_sensitive);
    vmobj_strcmp_equiv **t1;
    vmobj_strcmp_equiv *eq;
    wchar_t valch = *valstr;
    const wchar_t *start = valstr;

    /* check for an exact match first */
    if (refch == valch)
        return 1;
            
    /* check for a case-folded match if we're insensitive to case */
    if (fold_case)
    {
        /* try a minimum case-folded match to the one-character ref string */
        size_t ovallen = vallen, reflen = 1;
        const wchar_t *refstr = &refch;
        if (t3_compare_case_fold_min(valstr, vallen, refstr, reflen) == 0)
        {
            /* got it - return the length we consumed from the value string */
            return ovallen - vallen;
        }
    }

    /* check for a reference equivalence mapping */
    if ((t1 = ext->equiv[(refch >> 8) & 0xFF]) != 0
        && (eq = t1[refch & 0xFF]) != 0)
    {
        /* match each character from the mapping string */
        const wchar_t *vp;
        size_t vlen;
        for (vp = eq->val_ch, vlen = eq->val_ch_cnt ;
             vallen != 0 && vlen != 0 ; )
        {
            /* get this mapping character */
            refch = *vp;

            /* if we have an exact match, keep going */
            if (refch == valch)
            {
                /* matched exactly - skip this character and keep going */
                ++valstr, --vallen;
                ++vp, --vlen;
                continue;
            }

            /* check for a case-folded match if appropriate */
            if (fold_case
                && t3_compare_case_fold_min(valstr, vallen, vp, vlen) == 0)
            {
                /* matched - keep going */
                continue;
            }

            /* no match */
            return 0;
        }

        /* we've matched the mapping - return the match length */
        return valstr - start;
    }

    /* it doesn't match any of the possibilities */
    return 0;
}